

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_wally_util.cpp
# Opt level: O2

string * __thiscall
cfd::core::WallyUtil::GetMnemonicWord_abi_cxx11_
          (string *__return_storage_ptr__,WallyUtil *this,words *wordlist,size_t index)

{
  CfdException *pCVar1;
  char *wally_string;
  allocator local_4d;
  int ret;
  char *wally_word;
  undefined1 local_40 [32];
  size_t index_local;
  
  index_local = (size_t)wordlist;
  if ((words *)0x7ff < wordlist) {
    local_40._0_8_ = "cfdcore_wally_util.cpp";
    local_40._8_4_ = 0x137;
    local_40._16_8_ = "GetMnemonicWord";
    logger::warn<unsigned_long_const&>
              ((CfdSourceLocation *)local_40,"GetMnemonicWord invalid index error. index=[{}]",
               &index_local);
    pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)local_40,"GetMnemonicWord invalid index error.",(allocator *)&wally_word);
    CfdException::CfdException(pCVar1,kCfdOutOfRangeError,(string *)local_40);
    __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  wally_word = (char *)0x0;
  ret = bip39_get_word((words *)this,(size_t)wordlist,&wally_word);
  if (ret == 0) {
    ConvertStringAndFree_abi_cxx11_(__return_storage_ptr__,(WallyUtil *)wally_word,wally_string);
    return __return_storage_ptr__;
  }
  local_40._0_8_ = "cfdcore_wally_util.cpp";
  local_40._8_4_ = 0x140;
  local_40._16_8_ = "GetMnemonicWord";
  logger::warn<int&>((CfdSourceLocation *)local_40,"Get languages error. ret=[{}]",&ret);
  pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_40,"Get languages error.",&local_4d);
  CfdException::CfdException(pCVar1,kCfdIllegalArgumentError,(string *)local_40);
  __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

std::string WallyUtil::GetMnemonicWord(
    const words* wordlist, const size_t index) {
  if (kWordlistLength <= index) {
    warn(
        CFD_LOG_SOURCE, "GetMnemonicWord invalid index error. index=[{}]",
        index);
    throw CfdException(
        CfdError::kCfdOutOfRangeError, "GetMnemonicWord invalid index error.");
  }

  char* wally_word = NULL;
  int ret = bip39_get_word(wordlist, index, &wally_word);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "Get languages error. ret=[{}]", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Get languages error.");
  }

  std::string word = ConvertStringAndFree(wally_word);
  return word;
}